

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_math.hpp
# Opt level: O2

double __thiscall
trng::int_math::power<2147483647,_123567893>::pow
          (power<2147483647,_123567893> *this,double __x,double __y)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint in_ESI;
  long lVar4;
  
  lVar3 = 0x75d7f15;
  lVar2 = 1;
  for (; 0 < (int)in_ESI; in_ESI = in_ESI >> 1) {
    if ((in_ESI & 1) != 0) {
      lVar1 = ((ulong)(lVar2 * lVar3) >> 0x1f) + (ulong)((uint)(lVar2 * lVar3) & 0x7fffffff);
      lVar4 = lVar1 << 0x20;
      lVar2 = lVar4 + -0x7fffffff00000000;
      if ((uint)lVar1 < 0x7fffffff) {
        lVar2 = lVar4;
      }
      lVar2 = lVar2 >> 0x20;
    }
    lVar1 = ((ulong)(lVar3 * lVar3) >> 0x1f) + (ulong)((uint)(lVar3 * lVar3) & 0x7ffffffd);
    lVar4 = lVar1 << 0x20;
    lVar3 = lVar4 + -0x7fffffff00000000;
    if ((uint)lVar1 < 0x7fffffff) {
      lVar3 = lVar4;
    }
    lVar3 = lVar3 >> 0x20;
  }
  return __x;
}

Assistant:

int32_t pow(int32_t n) {
        int64_t p{1}, t{b};
        while (n > 0) {
          if ((n & 0x1) == 0x1)
            p = modulo<m, 1>(p * t);
          t = modulo<m, 1>(t * t);
          n /= 2;
        }
        return static_cast<int32_t>(p);
      }